

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O2

uint64_t __thiscall
GmmLib::GmmResourceInfoCommon::GetFastClearWidth(GmmResourceInfoCommon *this,uint32_t MipLevel)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  GMM_TEXTURE_CALC *pGVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 in_register_00000034;
  uint64_t uVar3;
  
  iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x16])(this,CONCAT44(in_register_00000034,MipLevel));
  uVar3 = CONCAT44(extraout_var,iVar1);
  iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x40])(this);
  iVar2 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
  pGVar4 = GmmGetTextureCalc((GMM_LIB_CONTEXT *)CONCAT44(extraout_var_00,iVar2));
  switch(iVar1) {
  case 1:
    iVar1 = (*pGVar4->_vptr_GmmTextureCalc[0x1c])
                      (pGVar4,&this->Surf,uVar3,pGVar4->_vptr_GmmTextureCalc[0x1c]);
    return CONCAT44(extraout_var_02,iVar1);
  case 2:
  case 4:
    iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
    if ((*(byte *)(CONCAT44(extraout_var_01,iVar1) + 0x20) & 4) != 0) {
      return uVar3 + 0x3f >> 6;
    }
    break;
  default:
    iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
    if ((*(byte *)(CONCAT44(extraout_var_04,iVar1) + 0x20) & 4) == 0) {
      return uVar3;
    }
    break;
  case 8:
    iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
    if ((*(byte *)(CONCAT44(extraout_var_03,iVar1) + 0x20) & 4) == 0) {
      return uVar3 + 1 >> 1;
    }
    return uVar3 + 0xf >> 4;
  }
  return uVar3 + 7 >> 3;
}

Assistant:

uint64_t GmmLib::GmmResourceInfoCommon::GetFastClearWidth(uint32_t MipLevel)
{
    uint64_t width      = 0;
    uint64_t mipWidth   = GetMipWidth(MipLevel);
    uint32_t numSamples = GetNumSamples();

    GMM_TEXTURE_CALC *pTextureCalc;
    pTextureCalc = GMM_OVERRIDE_TEXTURE_CALC(&Surf, GetGmmLibContext());

    if(numSamples == 1)
    {
        width = pTextureCalc->ScaleFCRectWidth(&Surf, mipWidth);
    }
    else if(numSamples == 2 || numSamples == 4)
    {
        if (GetGmmLibContext()->GetSkuTable().FtrXe2Compression)
        {
            width = GFX_ALIGN(mipWidth, 64) / 64;
        }
        else
        {
            width = GFX_ALIGN(mipWidth, 8) / 8;
        }
    }
    else if(numSamples == 8)
    {
        if (GetGmmLibContext()->GetSkuTable().FtrXe2Compression)
        {
            width = GFX_ALIGN(mipWidth, 16) / 16;
        }
        else
        {
            width = GFX_ALIGN(mipWidth, 2) / 2;
        }
    }
    else // numSamples == 16
    {
        if (GetGmmLibContext()->GetSkuTable().FtrXe2Compression)
        {
            width = GFX_ALIGN(mipWidth, 8) / 8;
        }
        else
        {
            width = mipWidth;
        }
    }

    return width;
}